

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::ServiceDescriptorProto::SharedDtor(ServiceDescriptorProto *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->name_;
  if (psVar1 != (string *)internal::kEmptyString_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
  }
  if ((default_instance_ != this) && (this->options_ != (ServiceOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void ServiceDescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (this != default_instance_) {
    delete options_;
  }
}